

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  uint uVar2;
  int iVar3;
  uint extraout_EAX;
  uint uVar4;
  undefined4 extraout_var;
  Texture2D *this_00;
  NotSupportedError *this_01;
  long lVar5;
  deUint32 step;
  string local_50;
  
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar3) + 0x20))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_00;
  uVar4 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar4 = this->m_width;
  }
  if (uVar4 != 0) {
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    lVar5 = 0;
    iVar3 = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,iVar3);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)&local_50);
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8),
                 (Vec4 *)&local_50);
      iVar3 = iVar3 + 1;
      lVar5 = lVar5 + 0x28;
      uVar4 = extraout_EAX;
    } while ((ulong)((uVar2 ^ 0xffffffe0) + 0x21) * 0x28 != lVar5);
  }
  return uVar4;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}